

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

bool __thiscall packing::AssignedProtos::canFit(AssignedProtos *this,ProtoPalette *protoPal)

{
  byte bVar1;
  unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
  *this_00;
  const_iterator __first;
  const_iterator __last;
  size_type sVar2;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *colors;
  ProtoPalette *protoPal_local;
  AssignedProtos *this_local;
  
  this_00 = (unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
             *)uniqueColors(this);
  __first = ProtoPalette::begin(protoPal);
  __last = ProtoPalette::end(protoPal);
  std::
  unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
  ::insert<unsigned_short_const*>(this_00,__first,__last);
  sVar2 = std::
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          ::size((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)this_00);
  bVar1 = Options::maxOpaqueColors(&options);
  return sVar2 <= bVar1;
}

Assistant:

bool canFit(ProtoPalette const &protoPal) const {
		auto &colors = uniqueColors();
		colors.insert(protoPal.begin(), protoPal.end());
		return colors.size() <= options.maxOpaqueColors();
	}